

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O1

vector<unsigned_int,_std::allocator<unsigned_int>_> *
get_alignment_heads_by_layer
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          whisper_context_params *cparams,int il,int n_text_layer,int n_head)

{
  whisper_alignment_heads_preset wVar1;
  iterator iVar2;
  size_t sVar3;
  whisper_ahead *pwVar4;
  undefined8 in_RAX;
  mapped_type *pmVar5;
  int32_t i;
  uint uVar6;
  size_t sVar7;
  undefined8 local_38;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wVar1 = cparams->dtw_aheads_preset;
  if (wVar1 != WHISPER_AHEADS_NONE) {
    local_38 = in_RAX;
    if (wVar1 == WHISPER_AHEADS_CUSTOM) {
      pmVar5 = &cparams->dtw_aheads;
    }
    else {
      if (wVar1 == WHISPER_AHEADS_N_TOP_MOST) {
        if (n_head < 1 || il < n_text_layer - cparams->dtw_n_top) {
          return __return_storage_ptr__;
        }
        uVar6 = 0;
        do {
          local_38 = CONCAT44(uVar6,(uint)local_38);
          iVar2._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (__return_storage_ptr__,iVar2,(uint *)((long)&local_38 + 4));
          }
          else {
            *iVar2._M_current = uVar6;
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
          uVar6 = uVar6 + 1;
        } while (n_head != uVar6);
        return __return_storage_ptr__;
      }
      pmVar5 = std::
               map<whisper_alignment_heads_preset,_whisper_aheads,_std::less<whisper_alignment_heads_preset>,_std::allocator<std::pair<const_whisper_alignment_heads_preset,_whisper_aheads>_>_>
               ::at(&g_aheads,&cparams->dtw_aheads_preset);
    }
    sVar3 = pmVar5->n_heads;
    if (sVar3 != 0) {
      pwVar4 = pmVar5->heads;
      sVar7 = 0;
      do {
        if (pwVar4[sVar7].n_text_layer == il) {
          uVar6 = pwVar4[sVar7].n_head;
          local_38 = CONCAT44(local_38._4_4_,uVar6);
          iVar2._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar2._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(__return_storage_ptr__,iVar2,(uint *)&local_38);
          }
          else {
            *iVar2._M_current = uVar6;
            (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
            )._M_impl.super__Vector_impl_data._M_finish = iVar2._M_current + 1;
          }
        }
        sVar7 = sVar7 + 1;
      } while (sVar3 != sVar7);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<uint32_t> get_alignment_heads_by_layer(const whisper_context_params & cparams, int il, int n_text_layer, int n_head) {
    std::vector<uint32_t> ret;
    if (cparams.dtw_aheads_preset == WHISPER_AHEADS_NONE) {
        return ret;
    } else if (cparams.dtw_aheads_preset == WHISPER_AHEADS_N_TOP_MOST) {
        if (il >= n_text_layer - cparams.dtw_n_top) {
            for (int32_t i = 0; i < n_head; ++i) {
                ret.push_back(i);
            }
        }
    } else {
        const auto aheads = cparams.dtw_aheads_preset == WHISPER_AHEADS_CUSTOM ? cparams.dtw_aheads : g_aheads.at(cparams.dtw_aheads_preset);
        for (size_t i = 0; i < aheads.n_heads; ++i) {
            if (aheads.heads[i].n_text_layer == il) {
                ret.push_back(aheads.heads[i].n_head);
            }
        }
    }
    return ret;
}